

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_versions.cc
# Opt level: O2

bool bssl::set_version_bound(SSL_PROTOCOL_METHOD *method,uint16_t *out,uint16_t version)

{
  uint16_t uVar1;
  bool bVar2;
  uint16_t version_local;
  
  version_local = version;
  bVar2 = api_version_to_wire(&version_local,version);
  uVar1 = version_local;
  if ((bVar2) && (bVar2 = ssl_method_supports_version(method,version_local), bVar2)) {
    *out = uVar1;
    return true;
  }
  ERR_put_error(0x10,0,0xea,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_versions.cc"
                ,0x89);
  return false;
}

Assistant:

static bool set_version_bound(const SSL_PROTOCOL_METHOD *method, uint16_t *out,
                              uint16_t version) {
  if (!api_version_to_wire(&version, version) ||
      !ssl_method_supports_version(method, version)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNKNOWN_SSL_VERSION);
    return false;
  }

  *out = version;
  return true;
}